

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O1

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::read_perseus_style_file
          (Bitmap_cubical_complex_base<double> *this,char *perseus_style_file)

{
  Bitmap_cubical_complex_base<double> *pBVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  unsigned_long __val;
  long lVar10;
  unsigned_long __val_00;
  ulong uVar11;
  uint dimensionOfData;
  string line;
  Top_dimensional_cells_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  double filtrationLevel;
  string perseus_error;
  ifstream inFiltration;
  uint local_364;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  Top_dimensional_cells_iterator local_340;
  Bitmap_cubical_complex_base<double> *local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_318;
  double local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Top_dimensional_cells_iterator local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_320 = this;
  std::ifstream::ifstream(local_238,perseus_style_file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_360,"Could not open the file ","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_360);
    local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)plVar7) {
      local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      local_340.b = (Bitmap_cubical_complex_base<double> *)plVar5[3];
      local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_340.counter.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
    }
    local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::ios_base::failure[abi:cxx11]::failure(psVar6);
    __cxa_throw(psVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  std::istream::_M_extract<unsigned_int>((uint *)local_238);
  local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_318,(ulong)local_364);
  if (local_364 == 0) {
    __val = 1;
  }
  else {
    __val = 1;
    uVar11 = 0;
    do {
      std::istream::_M_extract<unsigned_int>((uint *)local_238);
      if (local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_318,
                   (iterator)
                   local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)&local_340);
      }
      else {
        *local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (uint)local_340.counter.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __val = __val * ((ulong)local_340.counter.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff);
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_364);
  }
  pBVar1 = local_320;
  set_up_containers(local_320,&local_318,true);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_340.counter,
             (ulong)((long)(pBVar1->sizes).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pBVar1->sizes).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 & 0xffffffff,
             (allocator_type *)&local_360);
  local_340.b = pBVar1;
  local_300 = 0.0;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    __val_00 = 0;
    do {
      local_360._M_string_length = 0;
      local_360.field_2._M_allocated_capacity =
           local_360.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_360,cVar2);
      if (local_360._M_string_length != 0) {
        iVar3 = __isoc99_sscanf(local_360._M_dataplus._M_p,"%lf",&local_300);
        if (iVar3 != 1) {
          std::operator+(&local_2d8,"Bad Perseus file format. This line is incorrect : ",&local_360)
          ;
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          local_2f8._M_string_length = std::iostream_category();
          local_2f8._M_dataplus._M_p._0_4_ = 1;
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar4,(error_code *)local_2d8._M_dataplus._M_p);
          __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        if ((long)local_340.counter.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_340.counter.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          lVar9 = 0;
        }
        else {
          lVar10 = 0;
          lVar9 = 0;
          do {
            lVar9 = lVar9 + (ulong)((local_340.b)->multipliers).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar10] *
                            (local_340.counter.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar10] * 2 + 1);
            lVar10 = lVar10 + 1;
          } while ((long)local_340.counter.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_340.counter.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3 != lVar10);
        }
        (local_320->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = local_300;
        Top_dimensional_cells_iterator::operator++(&local_258,&local_340);
        if (local_258.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.counter.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.counter.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __val_00 = __val_00 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  }
  else {
    __val_00 = 0;
  }
  if (__val_00 != __val) {
    std::__cxx11::to_string(&local_298,__val_00);
    std::operator+(&local_278,"Bad Perseus file format. Read ",&local_298);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar8) {
      local_2f8.field_2._M_allocated_capacity = *psVar8;
      local_2f8.field_2._8_8_ = plVar5[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::to_string(&local_2b8,__val);
    std::operator+(&local_2d8,&local_2f8,&local_2b8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_360._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_360._M_dataplus._M_p == psVar8) {
      local_360.field_2._M_allocated_capacity = *psVar8;
      local_360.field_2._8_8_ = plVar5[3];
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    }
    else {
      local_360.field_2._M_allocated_capacity = *psVar8;
    }
    local_360._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    std::ios_base::failure[abi:cxx11]::failure(psVar6);
    __cxa_throw(psVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  std::ifstream::close();
  impose_lower_star_filtration(local_320);
  if (local_340.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.counter.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_340.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Bitmap_cubical_complex_base<T>::read_perseus_style_file(const char* perseus_style_file) {
  std::ifstream inFiltration(perseus_style_file);
  if(!inFiltration) throw std::ios_base::failure(std::string("Could not open the file ") + perseus_style_file);
  unsigned dimensionOfData;
  inFiltration >> dimensionOfData;

#ifdef DEBUG_TRACES
  std::clog << "dimensionOfData : " << dimensionOfData << std::endl;
#endif

  std::vector<unsigned> sizes;
  sizes.reserve(dimensionOfData);
  // all dimensions multiplied
  std::size_t dimensions = 1;
  for (std::size_t i = 0; i != dimensionOfData; ++i) {
    unsigned size_in_this_dimension;
    inFiltration >> size_in_this_dimension;
    sizes.push_back(size_in_this_dimension);
    dimensions *= size_in_this_dimension;
#ifdef DEBUG_TRACES
    std::clog << "size_in_this_dimension : " << size_in_this_dimension << std::endl;
#endif
  }
  this->set_up_containers(sizes, true);

  Bitmap_cubical_complex_base<T>::Top_dimensional_cells_iterator it = this->top_dimensional_cells_iterator_begin();

  T filtrationLevel = 0.;
  std::size_t filtration_counter = 0;
  while (!inFiltration.eof()) {
    std::string line;
    getline(inFiltration, line);
    if (line.length() != 0) {
      int n = sscanf(line.c_str(), "%lf", &filtrationLevel);
      if (n != 1) {
        std::string perseus_error("Bad Perseus file format. This line is incorrect : " + line);
        throw std::ios_base::failure(perseus_error.c_str());
      }

#ifdef DEBUG_TRACES
      std::clog << "Cell of an index : " << it.compute_index_in_bitmap()
                << " and dimension: " << this->get_dimension_of_a_cell(it.compute_index_in_bitmap())
                << " get the value : " << filtrationLevel << std::endl;
#endif
      this->get_cell_data(*it) = filtrationLevel;
      ++it;
      ++filtration_counter;
    }
  }

  if (filtration_counter != dimensions) {
    std::string perseus_error("Bad Perseus file format. Read " + std::to_string(filtration_counter) + " expected " + \
      std::to_string(dimensions) + " values");
    throw std::ios_base::failure(perseus_error);
  }

  inFiltration.close();
  this->impose_lower_star_filtration();
}